

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MesmerizeOptions.cpp
# Opt level: O2

MesmerizeOptions *
MesmerizeOptions::FromArgs(MesmerizeOptions *__return_storage_ptr__,int argc,char **argv)

{
  int iVar1;
  long lVar2;
  long lVar3;
  runtime_error *prVar4;
  string optionValue;
  string optionName;
  string arg;
  string path;
  string resXstr;
  string resYstr;
  
  MesmerizeOptions(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>((string *)&path,"",(allocator<char> *)&arg);
  lVar3 = 1;
  do {
    if (argc <= lVar3) {
      if (path._M_string_length == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Path to root picture folder missing");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->PathToPicturesFolder);
      std::__cxx11::string::~string((string *)&path);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,argv[lVar3],(allocator<char> *)&optionName);
    lVar2 = std::__cxx11::string::find((char *)&arg,0x13389a);
    if (lVar2 == -1) {
      iVar1 = std::__cxx11::string::compare((char *)&path);
      if (iVar1 != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&optionName,"Invalid arg ",&arg);
        std::runtime_error::runtime_error(prVar4,(string *)&optionName);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_assign((string *)&path);
    }
    else {
      optionName._M_dataplus._M_p = (pointer)&optionName.field_2;
      optionName._M_string_length = 0;
      optionName.field_2._M_local_buf[0] = '\0';
      optionValue._M_dataplus._M_p = (pointer)&optionValue.field_2;
      optionValue._M_string_length = 0;
      optionValue.field_2._M_local_buf[0] = '\0';
      lVar2 = std::__cxx11::string::find((char *)&arg,0x1338aa);
      if (lVar2 == -1) {
        std::__cxx11::string::substr((ulong)&resXstr,(ulong)&arg);
        std::__cxx11::string::operator=((string *)&optionName,(string *)&resXstr);
        std::__cxx11::string::~string((string *)&resXstr);
        std::__cxx11::string::assign((char *)&optionValue);
      }
      else {
        std::__cxx11::string::find((char *)&arg,0x1338aa);
        std::__cxx11::string::substr((ulong)&resXstr,(ulong)&arg);
        std::__cxx11::string::operator=((string *)&optionName,(string *)&resXstr);
        std::__cxx11::string::~string((string *)&resXstr);
        std::__cxx11::string::find((char *)&arg,0x1338aa);
        std::__cxx11::string::substr((ulong)&resXstr,(ulong)&arg);
        std::__cxx11::string::operator=((string *)&optionValue,(string *)&resXstr);
        std::__cxx11::string::~string((string *)&resXstr);
      }
      iVar1 = std::__cxx11::string::compare((char *)&optionName);
      if (iVar1 == 0) {
        __return_storage_ptr__->IsFullScreen = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&optionName);
        if (iVar1 == 0) {
          __return_storage_ptr__->IsFullScreen = false;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&optionName);
          if (iVar1 == 0) {
            lVar2 = std::__cxx11::string::find((char *)&optionValue,0x1338c3);
            if (lVar2 == 0) {
              __return_storage_ptr__->IsResolutionSetToMax = true;
              __return_storage_ptr__->ResolutionX = -1;
              __return_storage_ptr__->ResolutionY = -1;
            }
            else {
              lVar2 = std::__cxx11::string::find((char *)&optionValue,0x1338c5);
              if (lVar2 == -1) {
                prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (prVar4,
                           "resolution option value is using an incorrect format, correct format is widthxheight"
                          );
                __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              std::__cxx11::string::find((char *)&optionValue,0x1338c5);
              std::__cxx11::string::substr((ulong)&resXstr,(ulong)&optionValue);
              std::__cxx11::string::find((char *)&optionValue,0x1338c5);
              std::__cxx11::string::substr((ulong)&resYstr,(ulong)&optionValue);
              __return_storage_ptr__->IsResolutionSetToMax = false;
              iVar1 = std::__cxx11::stoi(&resXstr,(size_t *)0x0,10);
              __return_storage_ptr__->ResolutionX = iVar1;
              iVar1 = std::__cxx11::stoi(&resYstr,(size_t *)0x0,10);
              __return_storage_ptr__->ResolutionY = iVar1;
              std::__cxx11::string::~string((string *)&resYstr);
              std::__cxx11::string::~string((string *)&resXstr);
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&optionName);
            if (iVar1 == 0) {
              iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
              __return_storage_ptr__->DisplayPictureDuration = iVar1 * 1000;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&optionName);
              if (iVar1 == 0) {
                iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
                __return_storage_ptr__->OpacityAnimationDuration = iVar1 * 1000;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&optionName);
                if (iVar1 == 0) {
                  iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
                  __return_storage_ptr__->ZoomAnimationDuration = iVar1 * 1000;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)&optionName);
                  if (iVar1 == 0) {
                    iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
                    __return_storage_ptr__->PanAnimationDuration = iVar1 * 1000;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)&optionName);
                    if (iVar1 == 0) {
                      iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
                      __return_storage_ptr__->ZoomPercentage = (float)iVar1 / 100.0;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)&optionName);
                      if (iVar1 != 0) {
                        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::operator+(&resXstr,"Unknown option: ",&optionName);
                        std::runtime_error::runtime_error(prVar4,(string *)&resXstr);
                        __cxa_throw(prVar4,&std::runtime_error::typeinfo,
                                    std::runtime_error::~runtime_error);
                      }
                      iVar1 = std::__cxx11::stoi(&optionValue,(size_t *)0x0,10);
                      __return_storage_ptr__->PanPercentage = (float)iVar1 / 100.0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&optionValue);
      std::__cxx11::string::~string((string *)&optionName);
    }
    std::__cxx11::string::~string((string *)&arg);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

MesmerizeOptions MesmerizeOptions::FromArgs(int argc, const char** argv) {
    MesmerizeOptions options;
    std::string path = "";
    for(int i = 1; i < argc; i++) {
        std::string arg(argv[i]);
        if (arg.find("--") == std::string::npos) {
            if (path.compare("") != 0)
                throw std::runtime_error("Invalid arg " + arg);

            path = arg; //we assume that the non-option (no --) is the path
        }else{
            std::string optionName;
            std::string optionValue;

            if (arg.find("=") == std::string::npos) {
                optionName = arg.substr(2);
                optionValue = "";
            } else {
                optionName = arg.substr(2, arg.find("=") - 2);
                optionValue = arg.substr(arg.find("=") + 1);
            }
            if (!optionName.compare("full-screen")){
                options.IsFullScreen = true;
            }else if (!optionName.compare("window")){
                options.IsFullScreen = false;
            }else if (!optionName.compare("resolution")) {
                if (optionValue.find("max") == 0) {
                    options.IsResolutionSetToMax = true;
                    options.ResolutionX = -1;
                    options.ResolutionY = -1;
                } else {
                    if (optionValue.find("x") == std::string::npos)
                        throw std::runtime_error(
                                "resolution option value is using an incorrect format, correct format is widthxheight");
                    std::string resXstr = optionValue.substr(0, optionValue.find("x"));
                    std::string resYstr = optionValue.substr(optionValue.find("x") + 1);
                    options.IsResolutionSetToMax = false;
                    options.ResolutionX = std::stoi(resXstr);
                    options.ResolutionY = std::stoi(resYstr);
                }
            }else if (!optionName.compare("display-picture-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.DisplayPictureDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("opacity-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.OpacityAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.ZoomAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("pan-animation-duration")) {
                int durationInSeconds = std::stoi(optionValue);
                options.PanAnimationDuration = durationInSeconds * 1000;
            }else if (!optionName.compare("zoom-percentage")) {
                int zoomPercentage = std::stoi(optionValue);
                options.ZoomPercentage = zoomPercentage / 100.0f;
            }else if (!optionName.compare("pan-percentage")) {
                int panPercentage = std::stoi(optionValue);
                options.PanPercentage = panPercentage / 100.0f;
            }else {
                throw std::runtime_error("Unknown option: " + optionName);
            }
        }
    }



    if (path.empty()){
        throw std::runtime_error("Path to root picture folder missing");
    }else {
        options.PathToPicturesFolder = path;
    }
    return options;
}